

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_example.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::ApiExample::DealableStreams
          (ApiExample *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *liquidity_providers)

{
  long lVar1;
  bool bVar2;
  reference pbVar3;
  pointer pBVar4;
  string *psVar5;
  undefined8 *puVar6;
  Tenor *pTVar7;
  Date *pDVar8;
  Date *pDVar9;
  Subject local_328 [31];
  allocator<char> local_309;
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [32];
  undefined8 local_2c0;
  FX local_2b8 [64];
  undefined8 local_278;
  string local_270 [32];
  Subject local_250 [8];
  Subject subject3;
  Subject local_238 [31];
  allocator<char> local_219;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [32];
  undefined8 local_1d0;
  FX local_1c8 [64];
  undefined8 local_188;
  string local_180 [32];
  Subject local_160 [8];
  Subject subject2;
  Subject local_148 [31];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [48];
  undefined8 local_d0;
  FX local_c8 [64];
  undefined8 local_88;
  string local_80 [24];
  Subject local_68 [8];
  Subject subject1;
  string local_50 [8];
  string lp;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *liquidity_providers_local;
  ApiExample *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(liquidity_providers);
  lp.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(liquidity_providers);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&lp.field_2 + 8));
    if (!bVar2) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_50,(string *)pbVar3);
    pBVar4 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    local_d0 = (**(code **)(*(long *)pBVar4 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_88 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Spot();
    psVar5 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::LiquidityProvider(local_80)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_100,"EURUSD",&local_101);
    psVar5 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::CurrencyPair(psVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_128,"EUR",&local_129);
    bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Currency(psVar5);
    puVar6 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Quantity(1230080.11);
    (**(code **)*puVar6)(local_68);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    price::subject::SubjectFactory::FX::~FX(local_c8);
    pBVar4 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    lVar1 = *(long *)(*(long *)pBVar4 + -0x30);
    bidfx_public_api::price::subject::Subject::Subject(local_148,local_68);
    (**(code **)(*(long *)(pBVar4 + lVar1) + 8))(pBVar4 + lVar1,local_148);
    price::subject::Subject::~Subject(local_148);
    pBVar4 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    local_1d0 = (**(code **)(*(long *)pBVar4 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_188 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Forward();
    psVar5 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                       (local_180);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1f0,"EURUSD",&local_1f1);
    psVar5 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_218,"EUR",&local_219);
    bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar5);
    pTVar7 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                                (1000000.0);
    puVar6 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar7);
    (**(code **)*puVar6)(local_160);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    price::subject::SubjectFactory::FX::~FX(local_1c8);
    pBVar4 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    lVar1 = *(long *)(*(long *)pBVar4 + -0x30);
    bidfx_public_api::price::subject::Subject::Subject(local_238,local_160);
    (**(code **)(*(long *)(pBVar4 + lVar1) + 8))(pBVar4 + lVar1,local_238);
    price::subject::Subject::~Subject(local_238);
    pBVar4 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    local_2c0 = (**(code **)(*(long *)pBVar4 + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_278 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Ndf();
    psVar5 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                       (local_270);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2e0,"USDKRW",&local_2e1);
    psVar5 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_308,"USD",&local_309);
    bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar5);
    pTVar7 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                                (2000000.0);
    pDVar8 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar7);
    pDVar9 = (Date *)operator_new(0xc);
    bidfx_public_api::tools::Date::Date(pDVar9,0x7e3,0xc,10);
    pDVar8 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::FixingDate
                               (pDVar8);
    pDVar9 = (Date *)operator_new(0xc);
    bidfx_public_api::tools::Date::Date(pDVar9,0x7e3,0xc,0xc);
    puVar6 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::SettlementDate(pDVar8);
    (**(code **)*puVar6)(local_250);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator(&local_309);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    price::subject::SubjectFactory::FX::~FX(local_2b8);
    pBVar4 = std::
             unique_ptr<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ::operator->(&this->subscriber_);
    lVar1 = *(long *)(*(long *)pBVar4 + -0x30);
    bidfx_public_api::price::subject::Subject::Subject(local_328,local_250);
    (**(code **)(*(long *)(pBVar4 + lVar1) + 8))(pBVar4 + lVar1,local_328);
    price::subject::Subject::~Subject(local_328);
    price::subject::Subject::~Subject(local_250);
    price::subject::Subject::~Subject(local_160);
    price::subject::Subject::~Subject(local_68);
    std::__cxx11::string::~string(local_50);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ApiExample::DealableStreams(std::vector<std::string> liquidity_providers)
{
    for (std::string lp : liquidity_providers)
    {
        Subject subject1 = subscriber_->Subjects().Fx().Stream().Spot()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1230080.11)
                .CreateSubject();

        subscriber_->Subscribe(subject1);
        //subscriber_->Unsubscribe(subject1);

        Subject subject2 = subscriber_->Subjects().Fx().Stream().Forward()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1000000)
                .Tenor(Tenor::IN_1_MONTH)
                .CreateSubject();

        subscriber_->Subscribe(subject2);
        //subscriber_->Unsubscribe(subject2);

        Subject subject3 = subscriber_->Subjects().Fx().Stream().Ndf()
                .LiquidityProvider(lp)
                .CurrencyPair("USDKRW")
                .Currency("USD")
                .Quantity(2000000)
                .Tenor(Tenor::IN_1_YEAR)
                .FixingDate(new Date(2019, 12, 10))
                .SettlementDate(new Date(2019, 12, 12))
                .CreateSubject();

        subscriber_->Subscribe(subject3);
        //subscriber_->Unsubscribe(subject3);
    }
}